

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O3

bool __thiscall Saturation::ConsequenceFinder::isRedundant(ConsequenceFinder *this,Clause *cl)

{
  long lVar1;
  uint uVar2;
  ulong n;
  long lVar3;
  
  uVar2 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (uVar2 != 0) {
    lVar3 = 0;
    lVar1 = DAT_00b521b0;
    do {
      n = (ulong)(cl->_literals[lVar3]->super_Term)._functor;
      if ((*(byte *)(*(long *)(*(long *)(lVar1 + 0x80) + n * 8) + 0x40) & 0x20) != 0) {
        if ((this->_redundant).super_Array<bool>._capacity <= n) {
          Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,n);
          lVar1 = DAT_00b521b0;
        }
        if ((this->_redundant).super_Array<bool>._array[n] != false) {
          return true;
        }
      }
      lVar3 = lVar3 + 1;
    } while ((uint)lVar3 < uVar2);
  }
  return false;
}

Assistant:

bool ConsequenceFinder::isRedundant(Clause* cl)
{
  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(_redundant[fn]) {
      return true;
    }
  }
  return false;
}